

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_key_share(ptls_key_exchange_algorithm_t **selected,ptls_iovec_t *peer_key,
                    ptls_key_exchange_algorithm_t **candidates,uint8_t **src,uint8_t *end,
                    int expect_one)

{
  int iVar1;
  long *in_RCX;
  long *in_RDX;
  uint8_t **in_RSI;
  ptls_iovec_t *in_RDI;
  long in_R8;
  int in_R9D;
  uint16_t *unaff_retaddr;
  ptls_key_exchange_algorithm_t **c;
  ptls_iovec_t key;
  uint16_t group;
  int ret;
  long *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  short local_32;
  int local_30;
  
  in_RDI->base = (uint8_t *)0x0;
  if ((in_R9D == 0) || (*in_RCX != in_R8)) {
    do {
      if (*in_RCX == in_R8) {
        return 0;
      }
      iVar1 = decode_key_share_entry(unaff_retaddr,in_RDI,in_RSI,(uint8_t *)in_RDX);
      local_50 = in_RDX;
      if (iVar1 != 0) {
        return iVar1;
      }
      for (; *local_50 != 0; local_50 = local_50 + 1) {
        if ((in_RDI->base == (uint8_t *)0x0) && (*(short *)*local_50 == local_32)) {
          in_RDI->base = (uint8_t *)*local_50;
          *in_RSI = local_48;
          in_RSI[1] = local_40;
        }
      }
    } while (in_R9D == 0);
    local_30 = 0x2f;
    if (in_RDI->base != (uint8_t *)0x0) {
      local_30 = 0;
    }
  }
  else {
    local_30 = 0x2f;
  }
  return local_30;
}

Assistant:

static int select_key_share(ptls_key_exchange_algorithm_t **selected, ptls_iovec_t *peer_key,
                            ptls_key_exchange_algorithm_t **candidates, const uint8_t **src, const uint8_t *const end,
                            int expect_one)
{
    int ret;

    *selected = NULL;

    if (expect_one && *src == end) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    while (*src != end) {
        uint16_t group;
        ptls_iovec_t key;
        if ((ret = decode_key_share_entry(&group, &key, src, end)) != 0)
            goto Exit;
        ptls_key_exchange_algorithm_t **c = candidates;
        for (; *c != NULL; ++c) {
            if (*selected == NULL && (*c)->id == group) {
                *selected = *c;
                *peer_key = key;
            }
        }
        if (expect_one) {
            ret = *selected != NULL ? 0 : PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    return ret;
}